

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall
BRTS_XZ<RemSP>::PerformLabelingMem
          (BRTS_XZ<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  ushort uVar3;
  uint uVar4;
  uint height;
  uint uVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer piVar10;
  Run *pRVar11;
  uint64_t *puVar12;
  Run *pRVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  Size local_2a0;
  undefined4 local_298;
  Mat *local_290;
  undefined8 local_288;
  Mat_<int> local_280;
  undefined1 local_220 [104];
  Mat local_1b8 [16];
  long local_1a8;
  long *local_170;
  MemMat<unsigned_char> local_158;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&local_158,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_2a0.height = (int)uVar2;
  local_2a0.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_220,&local_2a0,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar4 = *(uint *)&pMVar6->field_0xc;
  height = *(uint *)&pMVar6->field_0x8;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar4;
  uVar17 = uVar4 + 0x3f;
  if (-1 < (long)(int)uVar4) {
    uVar17 = uVar4;
  }
  iVar16 = ((int)uVar17 >> 6) + 1;
  (this->data_compressed).data_width = iVar16;
  uVar17 = iVar16 * height;
  uVar14 = 0xffffffffffffffff;
  if (-1 < (int)uVar17) {
    uVar14 = (ulong)uVar17 * 8;
  }
  puVar12 = (uint64_t *)operator_new__(uVar14);
  (this->data_compressed).bits = puVar12;
  InitCompressedDataMem(this,&this->data_compressed,&local_158);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar4;
  pRVar13 = (Run *)operator_new__((ulong)(((uVar4 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar13;
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  RemSP::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  RemSP::length_ = 1;
  FindRunsMem(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,
              (this->data_runs).runs);
  if (0 < (int)height) {
    pRVar13 = (this->data_runs).runs;
    uVar14 = 0;
    do {
      piVar10 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0;
      pRVar11 = pRVar13;
      do {
        pRVar13 = pRVar11;
        uVar19 = (uint)pRVar13->start_pos;
        if (pRVar13->start_pos == 0xffff) {
          if ((int)uVar17 < (int)uVar4) {
            lVar22 = (long)(int)uVar17;
            lVar18 = *local_170;
            lVar20 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar18 * uVar14 + local_1a8 + lVar22 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar20 * uVar14 + local_220._24_8_ + lVar22 * 4) = 0;
              lVar22 = lVar22 + 1;
              uVar17 = uVar4;
            } while ((int)uVar4 != lVar22);
          }
          pRVar13 = pRVar13 + 1;
        }
        else {
          uVar3 = pRVar13->end_pos;
          uVar5 = pRVar13->label;
          piVar10[(int)uVar5] = piVar10[(int)uVar5] + 1;
          uVar5 = puVar9[(int)uVar5];
          if ((int)uVar17 < (int)uVar19) {
            uVar21 = (ulong)(int)uVar17;
            lVar18 = *local_170;
            lVar20 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar18 * uVar14 + local_1a8 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar20 * uVar14 + local_220._24_8_ + uVar21 * 4) = 0;
              uVar21 = uVar21 + 1;
              uVar17 = uVar19;
            } while (uVar19 != uVar21);
          }
          if ((int)uVar17 < (int)(uint)uVar3) {
            uVar21 = (ulong)(int)uVar17;
            lVar18 = *local_170;
            lVar20 = *(long *)local_220._80_8_;
            do {
              piVar1 = (int *)(lVar18 * uVar14 + local_1a8 + uVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar20 * uVar14 + local_220._24_8_ + uVar21 * 4) = uVar5;
              uVar21 = uVar21 + 1;
            } while (uVar3 != uVar21);
            uVar17 = (uint)uVar3;
          }
        }
        pRVar11 = pRVar13 + 1;
      } while (uVar19 != 0xffff);
      uVar14 = uVar14 + 1;
    } while (uVar14 != height);
  }
  pauVar15 = (undefined1 (*) [16])operator_new(0x20);
  pauVar15[1] = (undefined1  [16])0x0;
  *pauVar15 = (undefined1  [16])0x0;
  puVar7 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar15;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar15 + 2);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar15 + 2);
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)puVar8 - (long)puVar7);
  }
  local_288 = 0;
  local_298 = 0x81010004;
  local_290 = &local_158.accesses_.super_Mat;
  cv::sum((_InputArray *)&local_280);
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_280._0_8_ - 9.223372036854776e+18) &
       (long)(double)local_280._0_8_ >> 0x3f | (long)(double)local_280._0_8_;
  local_288 = 0;
  local_298 = 0x81010004;
  local_290 = local_1b8;
  cv::sum((_InputArray *)&local_280);
  puVar7 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7[1] = (long)((double)local_280._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_280._0_8_ >> 0x3f | (long)(double)local_280._0_8_;
  if ((long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar14 = 0;
  }
  else {
    lVar18 = (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar23 = 0.0;
    lVar20 = 0;
    do {
      dVar23 = dVar23 + (double)RemSP::mem_P_.accesses_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar18 + (ulong)(lVar18 == 0) != lVar20);
    uVar14 = (long)(dVar23 - 9.223372036854776e+18) & (long)dVar23 >> 0x3f | (long)dVar23;
  }
  puVar7[2] = uVar14;
  MemMat<int>::GetImage(&local_280,(MemMat<int> *)local_220);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_280.super_Mat);
  cv::Mat::~Mat(&local_280.super_Mat);
  pRVar13 = (this->data_runs).runs;
  if (pRVar13 != (Run *)0x0) {
    operator_delete__(pRVar13);
  }
  puVar12 = (this->data_compressed).bits;
  if (puVar12 != (uint64_t *)0x0) {
    operator_delete__(puVar12);
  }
  cv::Mat::~Mat(local_1b8);
  cv::Mat::~Mat((Mat *)(local_220 + 8));
  cv::Mat::~Mat(&local_158.accesses_.super_Mat);
  cv::Mat::~Mat(&local_158.img_.super_Mat);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) img_labels(i, j) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }